

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O1

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::
async_read_at_least(connection<websocketpp::config::asio::transport_config> *this,size_t num_bytes,
                   char *buf,size_t len,read_handler *handler)

{
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  element_type *peVar1;
  element_type *peVar2;
  io_service_ptr piVar3;
  io_service_ptr piVar4;
  size_t __n;
  stringstream s;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [40];
  undefined1 local_290 [16];
  undefined1 local_280 [24];
  element_type *local_268;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_260;
  _Alloc_hider local_258;
  reactive_socket_service<asio::ip::tcp> *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  _Any_data local_238;
  io_service_ptr local_228;
  element_type *peStack_220;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_218;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_210;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_208;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_200;
  _Any_data local_1f8;
  code *local_1e8;
  _Any_data local_1d8;
  error_code local_1c8;
  _Any_data local_1b8;
  _Any_data local_1a8;
  undefined1 local_198 [360];
  
  local_258._M_p = (pointer)handler;
  if ((((this->m_alog).
        super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr)->m_static_channels & 0x400) != 0) {
    __n = len;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b8._M_pod_data);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8._M_pod_data,"asio async_read_at_least: ",0x1a);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    this_00 = (this->m_alog).
              super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__cxx11::stringbuf::str();
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,local_2d8 + 0x10,__n);
    if ((element_type *)local_2d8._16_8_ != (element_type *)local_2b8) {
      operator_delete((void *)local_2d8._16_8_);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8._M_pod_data);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
  }
  peVar1 = (this->super_socket_con_type).m_socket.
           super___shared_ptr<asio::basic_stream_socket<asio::ip::tcp>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  peVar2 = (this->m_strand).super___shared_ptr<asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_268 = (element_type *)buf;
  local_260._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)len;
  get_shared((connection<websocketpp::config::asio::transport_config> *)local_2d8);
  local_208._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)handle_async_read;
  p_Stack_200 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<void_(const_std::error_code_&,_unsigned_long)>::function
            ((function<void_(const_std::error_code_&,_unsigned_long)> *)&local_1f8,
             (function<void_(const_std::error_code_&,_unsigned_long)> *)local_258._M_p);
  local_1d8._M_unused._M_member_pointer = local_2d8._0_8_;
  local_1d8._8_8_ = local_2d8._8_8_;
  local_2d8._0_16_ = ZEXT816(0) << 0x20;
  local_1b8._M_unused._M_object = local_208._M_pi;
  local_1b8._8_8_ = p_Stack_200;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1a8,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1f8);
  local_250 = (reactive_socket_service<asio::ip::tcp> *)&this->m_read_handler_allocator;
  local_248._M_allocated_capacity = (size_type)local_1b8._M_unused._0_8_;
  local_248._8_8_ = local_1b8._8_8_;
  std::
  _Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
  ::_Tuple_impl((_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_238,
                (_Tuple_impl<0UL,_std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                 *)&local_1a8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._24_8_);
  }
  if ((code *)local_198._0_8_ != (code *)0x0) {
    (*(code *)local_198._0_8_)(&local_1a8,&local_1a8,3);
  }
  local_198._96_8_ = p_Stack_210;
  local_198._88_8_ = local_218._M_pi;
  local_290._8_8_ = peStack_220;
  piVar4 = local_228;
  local_2d8._16_8_ = peVar2->service_;
  local_2d8._24_8_ = peVar2->impl_;
  local_2b8._0_8_ = local_250;
  local_2b8._16_8_ = (per_descriptor_data)local_248._8_8_;
  local_2b8._8_4_ = local_248._M_allocated_capacity._0_4_;
  local_2b8[0xc] = local_248._M_local_buf[4];
  local_2b8._13_3_ = local_248._M_allocated_capacity._5_3_;
  local_2b8._24_8_ = (void *)0x0;
  local_2b8._32_8_ = 0;
  local_290._0_8_ = (io_service_ptr)0x0;
  piVar3 = (io_service_ptr)local_290._0_8_;
  if (local_228 != (io_service_ptr)0x0) {
    local_2b8._24_8_ = local_238._M_unused._M_object;
    local_2b8._32_8_ = local_238._8_8_;
    local_228 = (io_service_ptr)0x0;
    peStack_220 = (element_type *)0x0;
    piVar3 = piVar4;
  }
  local_290._0_8_ = piVar3;
  local_218._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_210 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1a8._M_unused._M_object = local_268;
  local_1a8._8_8_ = local_260._M_pi;
  local_198._0_8_ = 0;
  local_198._8_4_ = 0;
  local_198._32_8_ = local_250;
  local_198._40_8_ = vmovlps_avx(local_2b8._8_16_);
  local_198._48_8_ = local_248._8_8_;
  local_198._56_8_ = (void *)0x0;
  local_198._64_8_ = 0;
  local_198._72_8_ = (io_service_ptr)0x0;
  local_198._80_8_ = local_290._8_8_;
  if (piVar3 != (io_service_ptr)0x0) {
    local_198._56_8_ = local_2b8._24_8_;
    local_198._64_8_ = local_2b8._32_8_;
    local_290 = ZEXT816(0) << 0x20;
    local_198._72_8_ = piVar3;
  }
  local_280._0_16_ = ZEXT816(0) << 0x20;
  local_1c8._M_value = 0;
  local_1b8._M_unused._M_member_pointer = num_bytes;
  local_1b8._8_8_ = peVar1;
  local_198._16_8_ = local_2d8._16_8_;
  local_198._24_8_ = local_2d8._24_8_;
  local_1c8._M_cat = (error_category *)std::_V2::system_category();
  ::asio::detail::
  read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_asio::detail::wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>_>
  ::operator()((read_op<asio::basic_stream_socket<asio::ip::tcp>,_asio::mutable_buffers_1,_const_asio::mutable_buffer_*,_asio::detail::transfer_at_least_t,_asio::detail::wrapped_handler<asio::io_context::strand,_websocketpp::transport::asio::custom_alloc_handler<std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio::transport_config>_>,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::function<void_(const_std::error_code_&,_unsigned_long)>,_const_std::error_code_&,_unsigned_long)>_>,_asio::detail::is_continuation_if_running>_>
                *)&local_1b8,&local_1c8,0,1);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._96_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._96_8_);
  }
  if ((io_service_ptr)local_198._72_8_ != (io_service_ptr)0x0) {
    (*(code *)local_198._72_8_)(local_198 + 0x38,local_198 + 0x38,3);
  }
  if ((element_type *)local_280._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_280._8_8_);
  }
  if ((_Manager_type)local_290._0_8_ != (_Manager_type)0x0) {
    (*(code *)local_290._0_8_)
              ((_Any_data *)(local_2b8 + 0x18),(_Any_data *)(local_2b8 + 0x18),__destroy_functor);
  }
  if (p_Stack_210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_210);
  }
  if (local_228 != (io_service_ptr)0x0) {
    (*(code *)local_228)(&local_238,&local_238,3);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
  }
  if (local_1e8 != (code *)0x0) {
    (*local_1e8)(&local_1f8,&local_1f8,__destroy_functor);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  return;
}

Assistant:

void async_read_at_least(size_t num_bytes, char *buf, size_t len,
        read_handler handler)
    {
        if (m_alog->static_test(log::alevel::devel)) {
            std::stringstream s;
            s << "asio async_read_at_least: " << num_bytes;
            m_alog->write(log::alevel::devel,s.str());
        }

        // TODO: safety vs speed ?
        // maybe move into an if devel block
        /*if (num_bytes > len) {
            m_elog->write(log::elevel::devel,
                "asio async_read_at_least error::invalid_num_bytes");
            handler(make_error_code(transport::error::invalid_num_bytes),
                size_t(0));
            return;
        }*/

        if (config::enable_multithreading) {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                m_strand->wrap(make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                ))
            );
        } else {
            lib::asio::async_read(
                socket_con_type::get_socket(),
                lib::asio::buffer(buf,len),
                lib::asio::transfer_at_least(num_bytes),
                make_custom_alloc_handler(
                    m_read_handler_allocator,
                    lib::bind(
                        &type::handle_async_read, get_shared(),
                        handler,
                        lib::placeholders::_1, lib::placeholders::_2
                    )
                )
            );    
        }
        
    }